

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O2

int writebintable(fitsfile *fptr,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long nrows;
  float elapcpu;
  double elapse;
  char extname [11];
  char *tunit [2];
  char *tform [2];
  char *ttype [2];
  
  builtin_strncpy(extname,"Speed_Test",0xb);
  lVar2 = 2500000;
  iVar1 = ffcrtb(fptr,2,2500000);
  if (iVar1 == 0) {
    ffgrsz(fptr,&nrows,status);
    lVar4 = 20000;
    if (nrows < 20000) {
      lVar4 = nrows;
    }
    nrows = lVar4;
    printf("Write %7drow x %dcol bintable %4ld rows/loop:",2500000,2);
    marktime(status);
    lVar4 = 1;
    for (; lVar2 != 0; lVar2 = lVar2 - lVar3) {
      lVar3 = nrows;
      if (lVar2 <= nrows) {
        lVar3 = lVar2;
      }
      ffpclj(fptr,1,lVar4,1,lVar3,sarray,status);
      ffpclj(fptr,2,lVar4,1,lVar3,sarray,status);
      lVar4 = lVar4 + lVar3;
    }
    ffflus(fptr,status);
    gettime(&elapse,&elapcpu,status);
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n",0,elapse,
           (double)(float)(((double)elapcpu / elapse) * 100.0),(double)(float)(20.0 / elapse));
    return *status;
  }
  printerror(*status);
}

Assistant:

int writebintable (fitsfile *fptr, int *status)

    /*********************************************************/
    /* Create a binary table extension containing 3 columns  */
    /*********************************************************/
{
    int tfields = 2;
    long nremain, ntodo, firstrow = 1, firstelem = 1, nrows;
    float rate, size, elapcpu, cpufrac;
    double elapse;

    char extname[] = "Speed_Test";           /* extension name */

    /* define the name, datatype, and physical units for the columns */
    char *ttype[] = { "first", "second" };
    char *tform[] = {"1J",       "1J"   };
    char *tunit[] = { " ",       " "    };

    /* append a new empty binary table onto the FITS file */

    if ( fits_create_tbl( fptr, BINARY_TBL, BROWS, tfields, ttype, tform,
                tunit, extname, status) )
         printerror( *status );

    /* get table row size and optimum number of rows to write per loop */
    fits_get_rowsize(fptr, &nrows, status);
    nrows = minvalue(nrows, SHTSIZE);
    nremain = BROWS;

    printf("Write %7drow x %dcol bintable %4ld rows/loop:", BROWS, tfields,
       nrows);
    marktime(status);

    while(nremain)
    {
      ntodo = minvalue(nrows, nremain);
      ffpclj(fptr, 1, firstrow, firstelem, ntodo, sarray, status);
      ffpclj(fptr, 2, firstrow, firstelem, ntodo, sarray, status);
      firstrow += ntodo;
      nremain -= ntodo;
    }

    ffflus(fptr, status);  /* flush all buffers to disk */

    gettime(&elapse, &elapcpu, status);

    cpufrac = elapcpu / elapse * 100.;
    size = BROWS * 8. / 1000000.;
    rate = size / elapse;
    printf(" %4.1fMB/%6.3fs(%3.0f) = %5.2fMB/s\n", size, elapse, cpufrac,rate);

    return( *status );
}